

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::LineInterpolationTest::iterate(LineInterpolationTest *this)

{
  size_type *psVar1;
  pointer pVVar2;
  ulong *puVar3;
  float *pfVar4;
  GLenum GVar5;
  TestLog *log;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  size_t **ppsVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  LineInterpolationTest *pLVar11;
  LineInterpolationMethod LVar12;
  long *plVar13;
  undefined8 *puVar14;
  RenderTarget *pRVar15;
  size_t **ppsVar16;
  ulong *puVar17;
  ulong uVar18;
  int iVar19;
  pointer pVVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  LineSceneSpec scene;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  Surface resultImage;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> lines;
  string iterationDescription;
  ScopedLogSection section;
  RasterizationArguments args;
  Vec4 colors [3];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  undefined1 local_268 [40];
  LineInterpolationTest *local_240;
  Surface local_238;
  long lStack_220;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> local_218;
  string local_1f8;
  ScopedLogSection local_1d8;
  RasterizationArguments local_1cc;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  float local_198 [2];
  undefined1 *puStack_190;
  float local_188 [2];
  float afStack_180 [14];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  iVar19 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<((ostringstream *)local_1b8,iVar19 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)local_2a8,0,(char *)0x0,0x1c103d9);
  ppsVar8 = (size_t **)&local_238.m_pixels.m_cap;
  ppsVar16 = (size_t **)(plVar13 + 2);
  if ((size_t **)*plVar13 == ppsVar16) {
    local_238.m_pixels.m_cap = (size_t)*ppsVar16;
    lStack_220 = plVar13[3];
    local_238._0_8_ = ppsVar8;
  }
  else {
    local_238.m_pixels.m_cap = (size_t)*ppsVar16;
    local_238._0_8_ = (size_t **)*plVar13;
  }
  local_238.m_pixels.m_ptr = (void *)plVar13[1];
  *plVar13 = (long)ppsVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_238);
  puVar3 = (ulong *)(local_288 + 0x10);
  puVar17 = (ulong *)(plVar13 + 2);
  if ((ulong *)*plVar13 == puVar17) {
    local_288._16_8_ = *puVar17;
    local_288._24_8_ = plVar13[3];
    local_288._0_8_ = puVar3;
  }
  else {
    local_288._16_8_ = *puVar17;
    local_288._0_8_ = (ulong *)*plVar13;
  }
  local_288._8_8_ = plVar13[1];
  *plVar13 = (long)puVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  pVVar2 = (pointer)((long)((Vec4 *)local_288._8_8_)->m_data + (long)(float *)local_268._8_8_);
  pVVar20 = (pointer)0xf;
  if ((ulong *)local_288._0_8_ != puVar3) {
    pVVar20 = (pointer)local_288._16_8_;
  }
  if (pVVar20 < pVVar2) {
    pVVar20 = (pointer)0xf;
    if ((pointer)local_268._0_8_ != (pointer)(local_268 + 0x10)) {
      pVVar20 = (pointer)local_268._16_8_;
    }
    if (pVVar20 < pVVar2) goto LAB_00f7a266;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace((ulong)local_268,0,(char *)0x0,local_288._0_8_);
  }
  else {
LAB_00f7a266:
    puVar14 = (undefined8 *)std::__cxx11::string::_M_append(local_288,local_268._0_8_);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  psVar1 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1f8.field_2._M_allocated_capacity = *psVar1;
    local_1f8.field_2._8_8_ = puVar14[3];
  }
  else {
    local_1f8.field_2._M_allocated_capacity = *psVar1;
    local_1f8._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_1f8._M_string_length = puVar14[1];
  *puVar14 = psVar1;
  puVar14[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((pointer)local_268._0_8_ != (pointer)(local_268 + 0x10)) {
    operator_delete((void *)local_268._0_8_,(ulong)((long)(float *)local_268._16_8_ + 1));
  }
  if ((ulong *)local_288._0_8_ != puVar3) {
    operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
  }
  if ((size_t **)local_238._0_8_ != ppsVar8) {
    operator_delete((void *)local_238._0_8_,local_238.m_pixels.m_cap + 1);
  }
  if ((pointer)local_2a8._0_8_ != (pointer)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,(ulong)((long)(float *)local_2a8._16_8_ + 1));
  }
  log = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  iVar19 = this->m_iteration;
  local_240 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,iVar19 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0x1c10744);
  pLVar11 = local_240;
  puVar17 = (ulong *)(plVar13 + 2);
  if ((ulong *)*plVar13 == puVar17) {
    local_288._16_8_ = *puVar17;
    local_288._24_8_ = plVar13[3];
    local_288._0_8_ = puVar3;
  }
  else {
    local_288._16_8_ = *puVar17;
    local_288._0_8_ = (ulong *)*plVar13;
  }
  local_288._8_8_ = plVar13[1];
  *plVar13 = (long)puVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_1d8,log,(string *)local_288,&local_1f8);
  if ((ulong *)local_288._0_8_ != puVar3) {
    operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
  }
  if ((size_t **)local_238._0_8_ != ppsVar8) {
    operator_delete((void *)local_238._0_8_,local_238.m_pixels.m_cap + 1);
  }
  iVar19 = (pLVar11->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&local_238,iVar19,iVar19);
  local_2a8._0_8_ = (pointer)0x0;
  local_2a8._8_8_ = (pointer)0x0;
  local_2a8._16_8_ = (pointer)0x0;
  local_268._16_8_ = (pointer)0x0;
  local_268._0_8_ = (pointer)0x0;
  local_268._8_8_ = (pointer)0x0;
  local_218.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8 = (undefined1  [8])0x3f800000;
  pp_Stack_1b0 = (_func_int **)0x3f80000000000000;
  local_1a8._M_allocated_capacity = 0x3f80000000000000;
  local_1a8._8_8_ = 0x3f80000000000000;
  local_198[0] = 0.0;
  local_198[1] = 0.0;
  puStack_190 = &DAT_3f8000003f800000;
  deRandom_init((deRandom *)local_288,pLVar11->m_iteration * 1000 + pLVar11->m_primitive + 0x7b);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2a8,6);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_268,6);
  if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4)) {
    lVar21 = 0;
    uVar23 = 0;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar23;
      fVar25 = deRandom_getFloat((deRandom *)local_288);
      *(float *)((long)(float *)local_2a8._0_8_ + lVar21) = fVar25 * 1.8 + -0.9;
      fVar25 = deRandom_getFloat((deRandom *)local_288);
      *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 4) = fVar25 * 1.8 + -0.9;
      *(undefined4 *)((long)(float *)local_2a8._0_8_ + lVar21 + 8) = 0;
      fVar25 = 1.0;
      if (pLVar11->m_projective == true) {
        fVar25 = deRandom_getFloat((deRandom *)local_288);
        fVar25 = fVar25 * 3.8 + 0.2;
        *(float *)((long)(float *)local_2a8._0_8_ + lVar21) =
             *(float *)((long)(float *)local_2a8._0_8_ + lVar21) * fVar25;
        *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 4) =
             *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 4) * fVar25;
        *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 8) =
             *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 8) * fVar25;
      }
      *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 0xc) = fVar25;
      uVar7 = *(undefined8 *)
               ((long)(local_1b8 +
                      lVar21 + (SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe)
                               * -0x18) + 8);
      puVar14 = (undefined8 *)((long)(float *)local_268._0_8_ + lVar21);
      *puVar14 = *(undefined8 *)
                  (local_1b8 +
                  lVar21 + (SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe) *
                           -0x18);
      puVar14[1] = uVar7;
      uVar23 = uVar23 + 1;
      lVar21 = lVar21 + 0x10;
    } while ((long)uVar23 < (long)(int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4));
  }
  GVar5 = pLVar11->m_primitive;
  if (GVar5 == 1) {
    if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1) {
      iVar19 = 0;
      do {
        local_1b8 = *(undefined1 (*) [8])((pointer)(local_2a8._0_8_ + (long)iVar19 * 0x10))->m_data;
        pp_Stack_1b0 = *(_func_int ***)
                        (((pointer)(local_2a8._0_8_ + (long)iVar19 * 0x10))->m_data + 2);
        local_1a8._M_allocated_capacity =
             *(undefined8 *)((pointer)(local_2a8._0_8_ + (long)(iVar19 + 1) * 0x10))->m_data;
        local_1a8._8_8_ =
             *(undefined8 *)(((pointer)(local_2a8._0_8_ + (long)(iVar19 + 1) * 0x10))->m_data + 2);
        local_198 = *(float (*) [2])((pointer)(local_268._0_8_ + (long)iVar19 * 0x10))->m_data;
        puStack_190 = *(undefined1 **)
                       (((pointer)(local_268._0_8_ + (long)iVar19 * 0x10))->m_data + 2);
        local_188 = *(float (*) [2])((pointer)(local_268._0_8_ + (long)(iVar19 + 1) * 0x10))->m_data
        ;
        afStack_180._0_8_ =
             *(undefined8 *)(((pointer)(local_268._0_8_ + (long)(iVar19 + 1) * 0x10))->m_data + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back(&local_218,(value_type *)local_1b8);
        iVar19 = iVar19 + 2;
      } while (iVar19 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1);
    }
  }
  else if (GVar5 == 3) {
    if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1) {
      lVar21 = 0x10;
      lVar22 = 0;
      do {
        pfVar4 = (float *)((long)((pointer)(local_2a8._0_8_ + -0x10))->m_data + lVar21);
        local_1b8 = *(undefined1 (*) [8])pfVar4;
        pp_Stack_1b0 = *(_func_int ***)(pfVar4 + 2);
        psVar1 = (size_type *)((long)(float *)local_2a8._0_8_ + lVar21);
        local_1a8._M_allocated_capacity = *psVar1;
        local_1a8._8_8_ = psVar1[1];
        pfVar4 = (float *)((long)((pointer)(local_268._0_8_ + -0x10))->m_data + lVar21);
        local_198 = *(float (*) [2])pfVar4;
        puStack_190 = *(undefined1 **)(pfVar4 + 2);
        pfVar4 = (float *)((long)(float *)local_268._0_8_ + lVar21);
        local_188 = *(float (*) [2])pfVar4;
        afStack_180._0_8_ = *(undefined8 *)(pfVar4 + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back(&local_218,(value_type *)local_1b8);
        lVar22 = lVar22 + 1;
        lVar21 = lVar21 + 0x10;
      } while (lVar22 < (local_2a8._8_8_ - local_2a8._0_8_) * 0x10000000 + -0x100000000 >> 0x20);
    }
  }
  else if ((GVar5 == 2) &&
          (uVar23 = (ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4, 0 < (int)uVar23)) {
    iVar19 = 0;
    do {
      uVar18 = (long)iVar19 % (long)(int)uVar23 & 0xffffffff;
      local_1b8 = *(undefined1 (*) [8])((pointer)(local_2a8._0_8_ + uVar18 * 0x10))->m_data;
      pp_Stack_1b0 = *(_func_int ***)(((pointer)(local_2a8._0_8_ + uVar18 * 0x10))->m_data + 2);
      iVar19 = iVar19 + 1;
      uVar23 = (long)iVar19 % (long)(int)uVar23 & 0xffffffff;
      local_1a8._M_allocated_capacity =
           *(undefined8 *)((pointer)(local_2a8._0_8_ + uVar23 * 0x10))->m_data;
      local_1a8._8_8_ = *(undefined8 *)(((pointer)(local_2a8._0_8_ + uVar23 * 0x10))->m_data + 2);
      local_198 = *(float (*) [2])((pointer)(local_268._0_8_ + uVar18 * 0x10))->m_data;
      puStack_190 = *(undefined1 **)(((pointer)(local_268._0_8_ + uVar18 * 0x10))->m_data + 2);
      local_188 = *(float (*) [2])((pointer)(local_268._0_8_ + uVar23 * 0x10))->m_data;
      afStack_180._0_8_ = *(undefined8 *)(((pointer)(local_268._0_8_ + uVar23 * 0x10))->m_data + 2);
      std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
      push_back(&local_218,(value_type *)local_1b8);
      uVar23 = (ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4;
    } while (iVar19 < (int)uVar23);
  }
  local_1b8 = (undefined1  [8])
              ((local_240->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1b0,"Generated vertices:",0x13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4)) {
    lVar21 = 0;
    lVar22 = 0;
    do {
      local_1b8 = (undefined1  [8])
                  ((local_240->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                  .m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,"\t",1);
      tcu::operator<<((ostream *)&pp_Stack_1b0,
                      (Vector<float,_4> *)((long)(float *)local_2a8._0_8_ + lVar21));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,",\tcolor= ",9);
      tcu::operator<<((ostream *)&pp_Stack_1b0,
                      (Vector<float,_4> *)((long)(float *)local_268._0_8_ + lVar21));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
      std::ios_base::~ios_base(local_140);
      lVar22 = lVar22 + 1;
      lVar21 = lVar21 + 0x10;
    } while (lVar22 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4));
  }
  pLVar11 = local_240;
  BaseRenderingCase::drawPrimitives
            (&local_240->super_BaseRenderingCase,&local_238,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2a8,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_268,
             local_240->m_primitive);
  local_288._0_8_ = (pointer)0x0;
  local_288._8_8_ = (pointer)0x0;
  local_288._16_8_ = 0;
  local_1cc.numSamples = (pLVar11->super_BaseRenderingCase).m_numSamples;
  local_1cc.subpixelBits = (pLVar11->super_BaseRenderingCase).m_subpixelBits;
  pRVar15 = Context::getRenderTarget((pLVar11->super_BaseRenderingCase).super_TestCase.m_context);
  local_1cc.redBits = (pRVar15->m_pixelFormat).redBits;
  pRVar15 = Context::getRenderTarget((pLVar11->super_BaseRenderingCase).super_TestCase.m_context);
  local_1cc.greenBits = (pRVar15->m_pixelFormat).greenBits;
  pRVar15 = Context::getRenderTarget((pLVar11->super_BaseRenderingCase).super_TestCase.m_context);
  uVar10 = local_288._16_8_;
  uVar9 = local_288._8_8_;
  uVar7 = local_288._0_8_;
  local_1cc.blueBits = (pRVar15->m_pixelFormat).blueBits;
  local_288._0_8_ =
       local_218.
       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_288._8_8_ =
       local_218.
       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_288._16_8_ =
       local_218.
       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_218.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)uVar7;
  local_218.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)uVar9;
  local_218.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar10;
  local_288._24_4_ = (pLVar11->super_BaseRenderingCase).m_lineWidth;
  LVar12 = tcu::verifyLineGroupInterpolation
                     (&local_238,(LineSceneSpec *)local_288,&local_1cc,
                      ((pLVar11->super_BaseRenderingCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log);
  if (LVar12 == LINEINTERPOLATION_STRICTLY_CORRECT) {
    local_1b8 = (undefined1  [8])&local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Pass","");
    tcu::ResultCollector::addResult(&pLVar11->m_result,QP_TEST_RESULT_PASS,(string *)local_1b8);
  }
  else if (LVar12 == LINEINTERPOLATION_PROJECTED) {
    local_1b8 = (undefined1  [8])
                ((pLVar11->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1b0,
               "Interpolation was calculated using coordinates projected onto major axis. This method does not produce the same values as the non-projecting method defined in the specification."
               ,0xb1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
    std::ios_base::~ios_base(local_140);
    local_1b8 = (undefined1  [8])&local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Interpolation was calculated using projected coordinateds","");
    tcu::ResultCollector::addResult
              (&pLVar11->m_result,QP_TEST_RESULT_QUALITY_WARNING,(string *)local_1b8);
  }
  else {
    if (LVar12 != LINEINTERPOLATION_INCORRECT) goto LAB_00f7ac6c;
    if ((((float)local_288._24_4_ == 1.0) && (!NAN((float)local_288._24_4_))) ||
       ((pLVar11->super_BaseRenderingCase).m_numSamples < 2)) {
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"Found invalid pixel values","");
      tcu::ResultCollector::addResult(&pLVar11->m_result,QP_TEST_RESULT_FAIL,(string *)local_1b8);
    }
    else {
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"Interpolation of multisampled wide lines failed","");
      tcu::ResultCollector::addResult
                (&pLVar11->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)local_1b8);
    }
  }
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
LAB_00f7ac6c:
  if ((pointer)local_288._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_288._0_8_,local_288._16_8_ - local_288._0_8_);
  }
  iVar19 = pLVar11->m_iteration + 1;
  pLVar11->m_iteration = iVar19;
  bVar24 = iVar19 != pLVar11->m_iterationCount;
  if (!bVar24) {
    tcu::ResultCollector::setTestContextResult
              (&pLVar11->m_result,
               (pLVar11->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx);
  }
  if (local_218.
      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.
                    super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.
                          super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.
                          super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_268._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ - local_268._0_8_);
  }
  if ((pointer)local_2a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ - local_2a8._0_8_);
  }
  tcu::Surface::~Surface(&local_238);
  tcu::TestLog::endSection(local_1d8.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  return (uint)bVar24;
}

Assistant:

LineInterpolationTest::IterateResult LineInterpolationTest::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<tcu::Vec4>					colorBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// generate scene
	generateVertices(m_iteration, drawBuffer, colorBuffer);
	extractLines(lines, drawBuffer, colorBuffer);

	// log
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
		for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
			m_testCtx.getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
	}

	// draw image
	drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitive);

	// compare
	{
		RasterizationArguments	args;
		LineSceneSpec			scene;
		LineInterpolationMethod	iterationResult;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.lines.swap(lines);
		scene.lineWidth = m_lineWidth;

		iterationResult = verifyLineGroupInterpolation(resultImage, scene, args, m_testCtx.getLog());
		switch (iterationResult)
		{
			case tcu::LINEINTERPOLATION_STRICTLY_CORRECT:
				// line interpolation matches the specification
				m_result.addResult(QP_TEST_RESULT_PASS, "Pass");
				break;

			case tcu::LINEINTERPOLATION_PROJECTED:
				// line interpolation weights are otherwise correct, but they are projected onto major axis
				m_testCtx.getLog()	<< tcu::TestLog::Message
									<< "Interpolation was calculated using coordinates projected onto major axis. "
									   "This method does not produce the same values as the non-projecting method defined in the specification."
									<< tcu::TestLog::EndMessage;
				m_result.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Interpolation was calculated using projected coordinateds");
				break;

			case tcu::LINEINTERPOLATION_INCORRECT:
				if (scene.lineWidth != 1.0f && m_numSamples > 1)
				{
					// multisampled wide lines might not be supported
					m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Interpolation of multisampled wide lines failed");
				}
				else
				{
					// line interpolation is incorrect
					m_result.addResult(QP_TEST_RESULT_FAIL, "Found invalid pixel values");
				}
				break;

			default:
				DE_ASSERT(false);
				break;
		}
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		m_result.setTestContextResult(m_testCtx);
		return STOP;
	}
	else
		return CONTINUE;
}